

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Server * __thiscall httplib::Server::Post(Server *this,char *pattern,Handler *handler)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_80;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  local_60;
  Handler *local_20;
  Handler *handler_local;
  char *pattern_local;
  Server *this_local;
  
  local_20 = handler;
  handler_local = (Handler *)pattern;
  pattern_local = (char *)this;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_80,pattern,0x10);
  std::
  make_pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>&>
            (&local_60,&local_80,handler);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::push_back(&this->post_handlers_,&local_60);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::~pair(&local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_80);
  return this;
}

Assistant:

inline Server& Server::Post(const char* pattern, Handler handler)
{
    post_handlers_.push_back(std::make_pair(std::regex(pattern), handler));
    return *this;
}